

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void * in_memory_snapshot_thread(void *args)

{
  void *pvVar1;
  fdb_doc *doc_00;
  fdb_status fVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  fdb_iterator *fit;
  fdb_doc *doc;
  fdb_kvs_handle *snap_db;
  timeval __test_begin;
  char value [256];
  char key [256];
  fdb_iterator *local_260;
  fdb_doc *local_258;
  fdb_kvs_handle *local_250;
  timeval local_248;
  char local_238 [256];
  char local_138 [264];
  
  gettimeofday(&local_248,(__timezone_ptr_t)0x0);
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)args,&local_250,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdb6,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_init(local_250,&local_260,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdba,"void *in_memory_snapshot_thread(void *)");
  }
  uVar5 = 0;
  do {
    uVar4 = (uint)uVar5;
    local_258 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_get(local_260,&local_258);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf(local_138,"key%d",uVar5);
    sprintf(local_238,"body%d",uVar5);
    doc_00 = local_258;
    pvVar1 = local_258->key;
    iVar3 = bcmp(pvVar1,local_138,local_258->keylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_138,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    pvVar1 = doc_00->body;
    iVar3 = bcmp(pvVar1,local_238,doc_00->bodylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_238,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    uVar4 = uVar4 + 1;
    uVar5 = (ulong)uVar4;
    fdb_doc_free(doc_00);
    fVar2 = fdb_iterator_next(local_260);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  if (uVar4 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    __assert_fail("i == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdc9,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_close(local_260);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_close(local_250);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdce,"void *in_memory_snapshot_thread(void *)");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xdcc);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xdcc,"void *in_memory_snapshot_thread(void *)");
}

Assistant:

void *in_memory_snapshot_thread(void *args)
{

    TEST_INIT();

    fdb_kvs_handle *db = (fdb_kvs_handle *)args;
    fdb_kvs_handle *snap_db;
    fdb_iterator *fit;
    fdb_status status;
    fdb_doc *doc;
    char key[256], value[256];

    // Open in-memory snapshot
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Iterate the in-memory snapshot
    status = fdb_iterator_init(snap_db, &fit, NULL, 0, NULL, 0, 0x0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    int i = 0;
    do {
        doc = NULL;
        status = fdb_iterator_get(fit, &doc);
        if (status != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        TEST_CMP(doc->key, key, doc->keylen);
        TEST_CMP(doc->body, value, doc->bodylen);
        i++;
        fdb_doc_free(doc);
    } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    TEST_CHK(i == 10);

    status = fdb_iterator_close(fit);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_close(snap_db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // shutdown
    thread_exit(0);
    return NULL;
}